

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O2

bool __thiscall QBmpHandler::canRead(QBmpHandler *this)

{
  bool bVar1;
  bool bVar2;
  QIODevice *device;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_format == BmpFormat && this->state == Ready) {
    device = QImageIOHandler::device(&this->super_QImageIOHandler);
    bVar1 = canRead(device);
    bVar2 = false;
    if ((!bVar1) || (bVar2 = false, this->state == Error)) goto LAB_002556a5;
  }
  else if (this->state == Error) {
    bVar2 = false;
    goto LAB_002556a5;
  }
  formatName((QByteArray *)&local_30,this);
  QImageIOHandler::setFormat(&this->super_QImageIOHandler,(QByteArray *)&local_30);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
  bVar2 = true;
LAB_002556a5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QBmpHandler::canRead() const
{
    if (m_format == BmpFormat && state == Ready && !canRead(device()))
        return false;

    if (state != Error) {
        setFormat(formatName());
        return true;
    }

    return false;
}